

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall ProcessorGenerator::generate_class_definition(ProcessorGenerator *this)

{
  bool bVar1;
  uint uVar2;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  t_service *ptVar3;
  ostream *poVar4;
  t_type *ptVar5;
  ulong uVar6;
  reference pptVar7;
  string *psVar8;
  string local_430;
  string local_410;
  string local_3f0;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_3d0;
  t_function **local_3c8;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  byte local_2da;
  byte local_2d9;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  byte local_292;
  allocator local_291;
  undefined1 local_290 [8];
  string ret_arg;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_50 [8];
  string parent_class;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  ProcessorGenerator *this_local;
  
  __x = t_service::get_functions(this->service_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                     *)((long)&parent_class.field_2 + 8));
  std::__cxx11::string::string(local_50);
  ptVar3 = t_service::get_extends(this->service_);
  if (ptVar3 == (t_service *)0x0) {
    bVar1 = std::operator==(&this->style_,"Cob");
    if (bVar1) {
      std::__cxx11::string::operator=(local_50,"::apache::thrift::async::TAsyncDispatchProcessor");
    }
    else {
      std::__cxx11::string::operator=(local_50,"::apache::thrift::TDispatchProcessor");
    }
    if ((this->generator_->gen_templates_ & 1U) != 0) {
      std::__cxx11::string::operator+=(local_50,"T<Protocol_>");
    }
  }
  else {
    std::__cxx11::string::operator=(local_50,(string *)&this->extends_);
  }
  poVar4 = std::operator<<(this->f_header_,(string *)&this->template_header_);
  poVar4 = std::operator<<(poVar4,"class ");
  poVar4 = std::operator<<(poVar4,(string *)&this->class_name_);
  poVar4 = std::operator<<(poVar4," : public ");
  poVar4 = std::operator<<(poVar4,local_50);
  poVar4 = std::operator<<(poVar4," {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(this->f_header_," protected:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  indent_up(this);
  poVar4 = this->f_header_;
  indent_abi_cxx11_(&local_80,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_80);
  poVar4 = std::operator<<(poVar4,"::std::shared_ptr<");
  poVar4 = std::operator<<(poVar4,(string *)&this->if_name_);
  poVar4 = std::operator<<(poVar4,"> iface_;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_80);
  poVar4 = this->f_header_;
  indent_abi_cxx11_(&local_a0,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_a0);
  poVar4 = std::operator<<(poVar4,"virtual ");
  poVar4 = std::operator<<(poVar4,(string *)&this->ret_type_);
  poVar4 = std::operator<<(poVar4,"dispatchCall(");
  poVar4 = std::operator<<(poVar4,(string *)&this->finish_cob_);
  poVar4 = std::operator<<(poVar4,"::apache::thrift::protocol::TProtocol* iprot, ");
  poVar4 = std::operator<<(poVar4,"::apache::thrift::protocol::TProtocol* oprot, ");
  poVar4 = std::operator<<(poVar4,"const std::string& fname, int32_t seqid");
  poVar4 = std::operator<<(poVar4,(string *)&this->call_context_);
  poVar4 = std::operator<<(poVar4,") override;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_a0);
  if ((this->generator_->gen_templates_ & 1U) != 0) {
    poVar4 = this->f_header_;
    indent_abi_cxx11_(&local_c0,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_c0);
    poVar4 = std::operator<<(poVar4,"virtual ");
    poVar4 = std::operator<<(poVar4,(string *)&this->ret_type_);
    poVar4 = std::operator<<(poVar4,"dispatchCallTemplated(");
    poVar4 = std::operator<<(poVar4,(string *)&this->finish_cob_);
    poVar4 = std::operator<<(poVar4,"Protocol_* iprot, Protocol_* oprot, ");
    poVar4 = std::operator<<(poVar4,"const std::string& fname, int32_t seqid");
    poVar4 = std::operator<<(poVar4,(string *)&this->call_context_);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  indent_down(this);
  poVar4 = std::operator<<(this->f_header_," private:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  indent_up(this);
  poVar4 = this->f_header_;
  indent_abi_cxx11_(&local_e0,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_e0);
  poVar4 = std::operator<<(poVar4,"typedef  void (");
  poVar4 = std::operator<<(poVar4,(string *)&this->class_name_);
  poVar4 = std::operator<<(poVar4,"::*");
  poVar4 = std::operator<<(poVar4,"ProcessFunction)(");
  poVar4 = std::operator<<(poVar4,(string *)&this->finish_cob_decl_);
  poVar4 = std::operator<<(poVar4,"int32_t, ");
  poVar4 = std::operator<<(poVar4,"::apache::thrift::protocol::TProtocol*, ");
  poVar4 = std::operator<<(poVar4,"::apache::thrift::protocol::TProtocol*");
  poVar4 = std::operator<<(poVar4,(string *)&this->call_context_decl_);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_e0);
  if ((this->generator_->gen_templates_ & 1U) == 0) {
    poVar4 = this->f_header_;
    indent_abi_cxx11_(&local_240,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_240);
    poVar4 = std::operator<<(poVar4,"typedef std::map<std::string, ProcessFunction> ");
    poVar4 = std::operator<<(poVar4,"ProcessMap;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_240);
  }
  else {
    poVar4 = this->f_header_;
    indent_abi_cxx11_(&local_100,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_100);
    poVar4 = std::operator<<(poVar4,"typedef void (");
    poVar4 = std::operator<<(poVar4,(string *)&this->class_name_);
    poVar4 = std::operator<<(poVar4,"::*");
    poVar4 = std::operator<<(poVar4,"SpecializedProcessFunction)(");
    poVar4 = std::operator<<(poVar4,(string *)&this->finish_cob_decl_);
    poVar4 = std::operator<<(poVar4,"int32_t, ");
    poVar4 = std::operator<<(poVar4,"Protocol_*, Protocol_*");
    poVar4 = std::operator<<(poVar4,(string *)&this->call_context_decl_);
    poVar4 = std::operator<<(poVar4,");");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_120,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_120);
    poVar4 = std::operator<<(poVar4,"struct ProcessFunctions {");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_140,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_140);
    poVar4 = std::operator<<(poVar4,"  ProcessFunction generic;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_160,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_160);
    poVar4 = std::operator<<(poVar4,"  SpecializedProcessFunction specialized;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_180,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_180);
    poVar4 = std::operator<<(poVar4,"  ProcessFunctions(ProcessFunction g, ");
    poVar4 = std::operator<<(poVar4,"SpecializedProcessFunction s) :");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_1a0,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_1a0);
    poVar4 = std::operator<<(poVar4,"    generic(g),");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_1c0,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_1c0);
    poVar4 = std::operator<<(poVar4,"    specialized(s) {}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_1e0,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_1e0);
    poVar4 = std::operator<<(poVar4,"  ProcessFunctions() : generic(nullptr), specialized(nullptr) "
                            );
    poVar4 = std::operator<<(poVar4,"{}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_200,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_200);
    poVar4 = std::operator<<(poVar4,"};");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_220,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_220);
    poVar4 = std::operator<<(poVar4,"typedef std::map<std::string, ProcessFunctions> ");
    poVar4 = std::operator<<(poVar4,"ProcessMap;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  poVar4 = this->f_header_;
  indent_abi_cxx11_(&local_260,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_260);
  poVar4 = std::operator<<(poVar4,"ProcessMap processMap_;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_260);
  parent_class.field_2._8_8_ =
       std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                 ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  while( true ) {
    ret_arg.field_2._8_8_ =
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&parent_class.field_2 + 8),
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&ret_arg.field_2 + 8));
    if (!bVar1) break;
    poVar4 = indent(this,this->f_header_);
    poVar4 = std::operator<<(poVar4,"void process_");
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)((long)&parent_class.field_2 + 8));
    psVar8 = t_function::get_name_abi_cxx11_(*pptVar7);
    poVar4 = std::operator<<(poVar4,(string *)psVar8);
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = std::operator<<(poVar4,(string *)&this->finish_cob_);
    poVar4 = std::operator<<(poVar4,
                             "int32_t seqid, ::apache::thrift::protocol::TProtocol* iprot, ::apache::thrift::protocol::TProtocol* oprot"
                            );
    poVar4 = std::operator<<(poVar4,(string *)&this->call_context_);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    if ((this->generator_->gen_templates_ & 1U) != 0) {
      poVar4 = indent(this,this->f_header_);
      poVar4 = std::operator<<(poVar4,"void process_");
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                             *)((long)&parent_class.field_2 + 8));
      psVar8 = t_function::get_name_abi_cxx11_(*pptVar7);
      poVar4 = std::operator<<(poVar4,(string *)psVar8);
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = std::operator<<(poVar4,(string *)&this->finish_cob_);
      poVar4 = std::operator<<(poVar4,"int32_t seqid, Protocol_* iprot, Protocol_* oprot");
      poVar4 = std::operator<<(poVar4,(string *)&this->call_context_);
      poVar4 = std::operator<<(poVar4,");");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    bVar1 = std::operator==(&this->style_,"Cob");
    if (bVar1) {
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                             *)((long)&parent_class.field_2 + 8));
      local_292 = 0;
      local_2d9 = 0;
      local_2da = 0;
      ptVar5 = t_function::get_returntype(*pptVar7);
      uVar2 = (*(ptVar5->super_t_doc)._vptr_t_doc[4])();
      if ((uVar2 & 1) == 0) {
        pptVar7 = __gnu_cxx::
                  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                               *)((long)&parent_class.field_2 + 8));
        ptVar5 = t_function::get_returntype(*pptVar7);
        type_name_abi_cxx11_(&local_2d8,this,ptVar5,false,false);
        local_2d9 = 1;
        std::operator+(&local_2b8,", const ",&local_2d8);
        local_2da = 1;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_290,&local_2b8,"& _return");
      }
      else {
        std::allocator<char>::allocator();
        local_292 = 1;
        std::__cxx11::string::string((string *)local_290,"",&local_291);
      }
      if ((local_2da & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_2b8);
      }
      if ((local_2d9 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_2d8);
      }
      if ((local_292 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_291);
      }
      poVar4 = this->f_header_;
      indent_abi_cxx11_(&local_300,this);
      poVar4 = std::operator<<(poVar4,(string *)&local_300);
      poVar4 = std::operator<<(poVar4,"void return_");
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                             *)((long)&parent_class.field_2 + 8));
      psVar8 = t_function::get_name_abi_cxx11_(*pptVar7);
      poVar4 = std::operator<<(poVar4,(string *)psVar8);
      poVar4 = std::operator<<(poVar4,"(::std::function<void(bool ok)> cob, int32_t seqid, ");
      poVar4 = std::operator<<(poVar4,"::apache::thrift::protocol::TProtocol* oprot, ");
      poVar4 = std::operator<<(poVar4,"void* ctx");
      poVar4 = std::operator<<(poVar4,(string *)local_290);
      poVar4 = std::operator<<(poVar4,");");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_300);
      if ((this->generator_->gen_templates_ & 1U) != 0) {
        poVar4 = this->f_header_;
        indent_abi_cxx11_(&local_320,this);
        poVar4 = std::operator<<(poVar4,(string *)&local_320);
        poVar4 = std::operator<<(poVar4,"void return_");
        pptVar7 = __gnu_cxx::
                  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                               *)((long)&parent_class.field_2 + 8));
        psVar8 = t_function::get_name_abi_cxx11_(*pptVar7);
        poVar4 = std::operator<<(poVar4,(string *)psVar8);
        poVar4 = std::operator<<(poVar4,"(::std::function<void(bool ok)> cob, int32_t seqid, ");
        poVar4 = std::operator<<(poVar4,"Protocol_* oprot, void* ctx");
        poVar4 = std::operator<<(poVar4,(string *)local_290);
        poVar4 = std::operator<<(poVar4,");");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_320);
      }
      poVar4 = this->f_header_;
      indent_abi_cxx11_(&local_340,this);
      poVar4 = std::operator<<(poVar4,(string *)&local_340);
      poVar4 = std::operator<<(poVar4,"void throw_");
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                             *)((long)&parent_class.field_2 + 8));
      psVar8 = t_function::get_name_abi_cxx11_(*pptVar7);
      poVar4 = std::operator<<(poVar4,(string *)psVar8);
      poVar4 = std::operator<<(poVar4,"(::std::function<void(bool ok)> cob, int32_t seqid, ");
      poVar4 = std::operator<<(poVar4,"::apache::thrift::protocol::TProtocol* oprot, void* ctx, ");
      poVar4 = std::operator<<(poVar4,"::apache::thrift::TDelayedException* _throw);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_340);
      if ((this->generator_->gen_templates_ & 1U) != 0) {
        poVar4 = this->f_header_;
        indent_abi_cxx11_(&local_360,this);
        poVar4 = std::operator<<(poVar4,(string *)&local_360);
        poVar4 = std::operator<<(poVar4,"void throw_");
        pptVar7 = __gnu_cxx::
                  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                               *)((long)&parent_class.field_2 + 8));
        psVar8 = t_function::get_name_abi_cxx11_(*pptVar7);
        poVar4 = std::operator<<(poVar4,(string *)psVar8);
        poVar4 = std::operator<<(poVar4,"(::std::function<void(bool ok)> cob, int32_t seqid, ");
        poVar4 = std::operator<<(poVar4,"Protocol_* oprot, void* ctx, ");
        poVar4 = std::operator<<(poVar4,"::apache::thrift::TDelayedException* _throw);");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_360);
      }
      std::__cxx11::string::~string((string *)local_290);
    }
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                *)((long)&parent_class.field_2 + 8));
  }
  poVar4 = std::operator<<(this->f_header_," public:");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&local_380,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_380);
  poVar4 = std::operator<<(poVar4,(string *)&this->class_name_);
  poVar4 = std::operator<<(poVar4,"(::std::shared_ptr<");
  poVar4 = std::operator<<(poVar4,(string *)&this->if_name_);
  poVar4 = std::operator<<(poVar4,"> iface) :");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_380);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    poVar4 = this->f_header_;
    indent_abi_cxx11_(&local_3a0,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_3a0);
    poVar4 = std::operator<<(poVar4,"  ");
    poVar4 = std::operator<<(poVar4,(string *)&this->extends_);
    poVar4 = std::operator<<(poVar4,"(iface),");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3a0);
  }
  poVar4 = this->f_header_;
  indent_abi_cxx11_(&local_3c0,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_3c0);
  poVar4 = std::operator<<(poVar4,"  iface_(iface) {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3c0);
  indent_up(this);
  local_3c8 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  parent_class.field_2._8_8_ = local_3c8;
  while( true ) {
    local_3d0._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&parent_class.field_2 + 8),&local_3d0);
    if (!bVar1) break;
    poVar4 = this->f_header_;
    indent_abi_cxx11_(&local_3f0,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_3f0);
    poVar4 = std::operator<<(poVar4,"processMap_[\"");
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)((long)&parent_class.field_2 + 8));
    psVar8 = t_function::get_name_abi_cxx11_(*pptVar7);
    poVar4 = std::operator<<(poVar4,(string *)psVar8);
    std::operator<<(poVar4,"\"] = ");
    std::__cxx11::string::~string((string *)&local_3f0);
    if ((this->generator_->gen_templates_ & 1U) == 0) {
      poVar4 = std::operator<<(this->f_header_,"&");
      poVar4 = std::operator<<(poVar4,(string *)&this->class_name_);
      poVar4 = std::operator<<(poVar4,"::process_");
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                             *)((long)&parent_class.field_2 + 8));
      psVar8 = t_function::get_name_abi_cxx11_(*pptVar7);
      std::operator<<(poVar4,(string *)psVar8);
    }
    else {
      poVar4 = std::operator<<(this->f_header_,"ProcessFunctions(");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      if ((this->generator_->gen_templates_only_ & 1U) == 0) {
        poVar4 = indent(this,this->f_header_);
        poVar4 = std::operator<<(poVar4,"  &");
        poVar4 = std::operator<<(poVar4,(string *)&this->class_name_);
        poVar4 = std::operator<<(poVar4,"::process_");
        pptVar7 = __gnu_cxx::
                  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                               *)((long)&parent_class.field_2 + 8));
        psVar8 = t_function::get_name_abi_cxx11_(*pptVar7);
        poVar4 = std::operator<<(poVar4,(string *)psVar8);
        poVar4 = std::operator<<(poVar4,",");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
      else {
        poVar4 = indent(this,this->f_header_);
        poVar4 = std::operator<<(poVar4,"  nullptr,");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
      poVar4 = indent(this,this->f_header_);
      poVar4 = std::operator<<(poVar4,"  &");
      poVar4 = std::operator<<(poVar4,(string *)&this->class_name_);
      poVar4 = std::operator<<(poVar4,"::process_");
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                             *)((long)&parent_class.field_2 + 8));
      psVar8 = t_function::get_name_abi_cxx11_(*pptVar7);
      poVar4 = std::operator<<(poVar4,(string *)psVar8);
      std::operator<<(poVar4,")");
    }
    poVar4 = std::operator<<(this->f_header_,";");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                *)((long)&parent_class.field_2 + 8));
  }
  indent_down(this);
  poVar4 = this->f_header_;
  indent_abi_cxx11_(&local_410,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_410);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&local_430,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_430);
  poVar4 = std::operator<<(poVar4,"virtual ~");
  poVar4 = std::operator<<(poVar4,(string *)&this->class_name_);
  poVar4 = std::operator<<(poVar4,"() {}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_410);
  indent_down(this);
  poVar4 = std::operator<<(this->f_header_,"};");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  if ((this->generator_->gen_templates_ & 1U) != 0) {
    poVar4 = std::operator<<(this->f_header_,"typedef ");
    poVar4 = std::operator<<(poVar4,(string *)&this->class_name_);
    poVar4 = std::operator<<(poVar4,"< ::apache::thrift::protocol::TDummyProtocol > ");
    poVar4 = std::operator<<(poVar4,(string *)&this->service_name_);
    poVar4 = std::operator<<(poVar4,(string *)&this->pstyle_);
    poVar4 = std::operator<<(poVar4,"Processor;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string(local_50);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  return;
}

Assistant:

void ProcessorGenerator::generate_class_definition() {
  // Generate the dispatch methods
  vector<t_function*> functions = service_->get_functions();
  vector<t_function*>::iterator f_iter;

  string parent_class;
  if (service_->get_extends() != nullptr) {
    parent_class = extends_;
  } else {
    if (style_ == "Cob") {
      parent_class = "::apache::thrift::async::TAsyncDispatchProcessor";
    } else {
      parent_class = "::apache::thrift::TDispatchProcessor";
    }

    if (generator_->gen_templates_) {
      parent_class += "T<Protocol_>";
    }
  }

  // Generate the header portion
  f_header_ << template_header_ << "class " << class_name_ << " : public " << parent_class << " {"
            << endl;

  // Protected data members
  f_header_ << " protected:" << endl;
  indent_up();
  f_header_ << indent() << "::std::shared_ptr<" << if_name_ << "> iface_;" << endl;
  f_header_ << indent() << "virtual " << ret_type_ << "dispatchCall(" << finish_cob_
            << "::apache::thrift::protocol::TProtocol* iprot, "
            << "::apache::thrift::protocol::TProtocol* oprot, "
            << "const std::string& fname, int32_t seqid" << call_context_ 
            << ") override;" << endl;
  if (generator_->gen_templates_) {
    f_header_ << indent() << "virtual " << ret_type_ << "dispatchCallTemplated(" << finish_cob_
              << "Protocol_* iprot, Protocol_* oprot, "
              << "const std::string& fname, int32_t seqid" << call_context_ << ");" << endl;
  }
  indent_down();

  // Process function declarations
  f_header_ << " private:" << endl;
  indent_up();

  // Declare processMap_
  f_header_ << indent() << "typedef  void (" << class_name_ << "::*"
            << "ProcessFunction)(" << finish_cob_decl_ << "int32_t, "
            << "::apache::thrift::protocol::TProtocol*, "
            << "::apache::thrift::protocol::TProtocol*" << call_context_decl_ << ");" << endl;
  if (generator_->gen_templates_) {
    f_header_ << indent() << "typedef void (" << class_name_ << "::*"
              << "SpecializedProcessFunction)(" << finish_cob_decl_ << "int32_t, "
              << "Protocol_*, Protocol_*" << call_context_decl_ << ");" << endl << indent()
              << "struct ProcessFunctions {" << endl << indent() << "  ProcessFunction generic;"
              << endl << indent() << "  SpecializedProcessFunction specialized;" << endl << indent()
              << "  ProcessFunctions(ProcessFunction g, "
              << "SpecializedProcessFunction s) :" << endl << indent() << "    generic(g)," << endl
              << indent() << "    specialized(s) {}" << endl << indent()
              << "  ProcessFunctions() : generic(nullptr), specialized(nullptr) "
              << "{}" << endl << indent() << "};" << endl << indent()
              << "typedef std::map<std::string, ProcessFunctions> "
              << "ProcessMap;" << endl;
  } else {
    f_header_ << indent() << "typedef std::map<std::string, ProcessFunction> "
              << "ProcessMap;" << endl;
  }
  f_header_ << indent() << "ProcessMap processMap_;" << endl;

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    indent(f_header_) << "void process_" << (*f_iter)->get_name() << "(" << finish_cob_
                      << "int32_t seqid, ::apache::thrift::protocol::TProtocol* iprot, "
                         "::apache::thrift::protocol::TProtocol* oprot" << call_context_ << ");"
                      << endl;
    if (generator_->gen_templates_) {
      indent(f_header_) << "void process_" << (*f_iter)->get_name() << "(" << finish_cob_
                        << "int32_t seqid, Protocol_* iprot, Protocol_* oprot" << call_context_
                        << ");" << endl;
    }
    if (style_ == "Cob") {
      // XXX Factor this out, even if it is a pain.
      string ret_arg = ((*f_iter)->get_returntype()->is_void()
                            ? ""
                            : ", const " + type_name((*f_iter)->get_returntype()) + "& _return");
      f_header_ << indent() << "void return_" << (*f_iter)->get_name()
                << "(::std::function<void(bool ok)> cob, int32_t seqid, "
                << "::apache::thrift::protocol::TProtocol* oprot, "
                << "void* ctx" << ret_arg << ");" << endl;
      if (generator_->gen_templates_) {
        f_header_ << indent() << "void return_" << (*f_iter)->get_name()
                  << "(::std::function<void(bool ok)> cob, int32_t seqid, "
                  << "Protocol_* oprot, void* ctx" << ret_arg << ");" << endl;
      }
      // XXX Don't declare throw if it doesn't exist
      f_header_ << indent() << "void throw_" << (*f_iter)->get_name()
                << "(::std::function<void(bool ok)> cob, int32_t seqid, "
                << "::apache::thrift::protocol::TProtocol* oprot, void* ctx, "
                << "::apache::thrift::TDelayedException* _throw);" << endl;
      if (generator_->gen_templates_) {
        f_header_ << indent() << "void throw_" << (*f_iter)->get_name()
                  << "(::std::function<void(bool ok)> cob, int32_t seqid, "
                  << "Protocol_* oprot, void* ctx, "
                  << "::apache::thrift::TDelayedException* _throw);" << endl;
      }
    }
  }

  f_header_ << " public:" << endl << indent() << class_name_ << "(::std::shared_ptr<" << if_name_
            << "> iface) :" << endl;
  if (!extends_.empty()) {
    f_header_ << indent() << "  " << extends_ << "(iface)," << endl;
  }
  f_header_ << indent() << "  iface_(iface) {" << endl;
  indent_up();

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_header_ << indent() << "processMap_[\"" << (*f_iter)->get_name() << "\"] = ";
    if (generator_->gen_templates_) {
      f_header_ << "ProcessFunctions(" << endl;
      if (generator_->gen_templates_only_) {
        indent(f_header_) << "  nullptr," << endl;
      } else {
        indent(f_header_) << "  &" << class_name_ << "::process_" << (*f_iter)->get_name() << ","
                          << endl;
      }
      indent(f_header_) << "  &" << class_name_ << "::process_" << (*f_iter)->get_name() << ")";
    } else {
      f_header_ << "&" << class_name_ << "::process_" << (*f_iter)->get_name();
    }
    f_header_ << ";" << endl;
  }

  indent_down();
  f_header_ << indent() << "}" << endl << endl << indent() << "virtual ~" << class_name_ << "() {}"
            << endl;
  indent_down();
  f_header_ << "};" << endl << endl;

  if (generator_->gen_templates_) {
    // Generate a backwards compatible typedef, for callers who don't know
    // about the new template-style code.
    //
    // We can't use TProtocol as the template parameter, since ProcessorT
    // provides overloaded versions of most methods, one of which accepts
    // TProtocol pointers, and one which accepts Protocol_ pointers.  This
    // results in a compile error if instantiated with Protocol_ == TProtocol.
    // Therefore, we define TDummyProtocol solely so we can use it as the
    // template parameter here.
    f_header_ << "typedef " << class_name_ << "< ::apache::thrift::protocol::TDummyProtocol > "
              << service_name_ << pstyle_ << "Processor;" << endl << endl;
  }
}